

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O2

void __thiscall OrderGrid::incDec(OrderGrid *this,int amount)

{
  int iVar1;
  long lVar2;
  uchar uVar3;
  int iVar4;
  OrderRow row;
  OrderRow local_14;
  
  local_14 = PatternModel::currentOrderRow(this->mModel);
  if (this->mChangeAll == true) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      iVar4 = (uint)local_14._M_elems[lVar2] + amount;
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      uVar3 = (uchar)iVar4;
      if (iVar4 < 1) {
        uVar3 = '\0';
      }
      local_14._M_elems[lVar2] = uVar3;
    }
  }
  else {
    iVar4 = PatternModel::cursorTrack(this->mModel);
    iVar1 = (uint)local_14._M_elems[iVar4] + amount;
    if (0xfe < iVar1) {
      iVar1 = 0xff;
    }
    uVar3 = '\0';
    if (0 < iVar1) {
      uVar3 = (uchar)iVar1;
    }
    local_14._M_elems[iVar4] = uVar3;
  }
  PatternModel::setOrderRow(this->mModel,local_14);
  return;
}

Assistant:

void OrderGrid::incDec(int amount) {
    auto row = mModel.currentOrderRow();

    auto addId = [amount](uint8_t &id) {
        id = (uint8_t)std::clamp((int)id + amount, 0, 0xFF);
    };
    
    if (mChangeAll) {
        std::for_each(row.begin(), row.end(), addId);
    } else {
        addId(row[mModel.cursorTrack()]);
    }

    mModel.setOrderRow(row);
}